

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O3

int codebook_decode_deinterleave_repeat
              (vorb *f,Codebook *c,float **outputs,int ch,int *c_inter_p,int *p_inter_p,int len,
              int total_decode)

{
  byte bVar1;
  codetype *pcVar2;
  float *pfVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  float fVar14;
  
  if (c->lookup_type == '\0') {
LAB_0012069d:
    f->error = VORBIS_invalid_stream;
    iVar7 = 0;
  }
  else {
    iVar7 = *c_inter_p;
    iVar12 = *p_inter_p;
    if (0 < total_decode) {
      uVar9 = c->dimensions;
      do {
        if (f->valid_bits < 10) {
          if (f->valid_bits == 0) {
            f->acc = 0;
          }
          do {
            if (((f->last_seg != 0) && (f->bytes_in_seg == '\0')) ||
               (iVar6 = get8_packet_raw(f), iVar6 == -1)) break;
            iVar10 = f->valid_bits;
            f->acc = f->acc + (iVar6 << ((byte)iVar10 & 0x1f));
            f->valid_bits = iVar10 + 8;
          } while (iVar10 < 0x11);
        }
        iVar6 = (int)c->fast_huffman[f->acc & 0x3ff];
        if (c->fast_huffman[f->acc & 0x3ff] < 0) {
          iVar6 = codebook_decode_scalar_raw(f,c);
          iVar10 = iVar6;
        }
        else {
          bVar1 = c->codeword_lengths[iVar6];
          f->acc = f->acc >> (bVar1 & 0x1f);
          iVar10 = f->valid_bits - (uint)bVar1;
          iVar11 = iVar10;
          if (iVar10 < 1) {
            iVar11 = 0;
          }
          f->valid_bits = iVar11;
        }
        if (iVar10 < 0) {
          if ((f->bytes_in_seg == '\0') && (f->last_seg != 0)) {
            return 0;
          }
          goto LAB_0012069d;
        }
        uVar5 = (len * ch - iVar12 * ch) + iVar7;
        if ((int)(uVar9 + iVar7 + iVar12 * ch) <= len * ch) {
          uVar5 = uVar9;
        }
        uVar9 = uVar5;
        iVar6 = iVar6 * c->dimensions;
        if (c->sequence_p == '\0') {
          if (0 < (int)uVar9) {
            lVar8 = (long)iVar6;
            uVar13 = (ulong)uVar9;
            do {
              pfVar3 = outputs[iVar7];
              if (pfVar3 != (float *)0x0) {
                pfVar3[iVar12] = c->multiplicands[lVar8] + 0.0 + pfVar3[iVar12];
              }
              iVar6 = iVar7 + 1;
              iVar7 = iVar6;
              if (iVar6 == ch) {
                iVar7 = 0;
              }
              iVar12 = iVar12 + (uint)(iVar6 == ch);
              lVar8 = lVar8 + 1;
              uVar13 = uVar13 - 1;
            } while (uVar13 != 0);
          }
        }
        else if (0 < (int)uVar9) {
          pcVar2 = c->multiplicands;
          fVar14 = 0.0;
          uVar13 = 0;
          do {
            fVar14 = fVar14 + pcVar2[(long)iVar6 + uVar13];
            pfVar3 = outputs[iVar7];
            if (pfVar3 != (float *)0x0) {
              pfVar3[iVar12] = pfVar3[iVar12] + fVar14;
            }
            iVar10 = iVar7 + 1;
            iVar7 = iVar10;
            if (iVar10 == ch) {
              iVar7 = 0;
            }
            iVar12 = iVar12 + (uint)(iVar10 == ch);
            uVar13 = uVar13 + 1;
          } while (uVar9 != uVar13);
        }
        iVar6 = total_decode - uVar9;
        bVar4 = (int)uVar9 <= total_decode;
        total_decode = iVar6;
      } while (iVar6 != 0 && bVar4);
    }
    *c_inter_p = iVar7;
    *p_inter_p = iVar12;
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

static int codebook_decode_deinterleave_repeat(vorb *f, Codebook *c, float **outputs, int ch, int *c_inter_p, int *p_inter_p, int len, int total_decode)
{
   int c_inter = *c_inter_p;
   int p_inter = *p_inter_p;
   int i,z, effective = c->dimensions;

   // type 0 is only legal in a scalar context
   if (c->lookup_type == 0)   return error(f, VORBIS_invalid_stream);

   while (total_decode > 0) {
      float last = CODEBOOK_ELEMENT_BASE(c);
      DECODE_VQ(z,f,c);
      #ifndef STB_VORBIS_DIVIDES_IN_CODEBOOK
      assert(!c->sparse || z < c->sorted_entries);
      #endif
      if (z < 0) {
         if (!f->bytes_in_seg)
            if (f->last_seg) return FALSE;
         return error(f, VORBIS_invalid_stream);
      }

      // if this will take us off the end of the buffers, stop short!
      // we check by computing the length of the virtual interleaved
      // buffer (len*ch), our current offset within it (p_inter*ch)+(c_inter),
      // and the length we'll be using (effective)
      if (c_inter + p_inter*ch + effective > len * ch) {
         effective = len*ch - (p_inter*ch - c_inter);
      }

   #ifdef STB_VORBIS_DIVIDES_IN_CODEBOOK
      if (c->lookup_type == 1) {
         int div = 1;
         for (i=0; i < effective; ++i) {
            int off = (z / div) % c->lookup_values;
            float val = CODEBOOK_ELEMENT_FAST(c,off) + last;
            if (outputs[c_inter])
               outputs[c_inter][p_inter] += val;
            if (++c_inter == ch) { c_inter = 0; ++p_inter; }
            if (c->sequence_p) last = val;
            div *= c->lookup_values;
         }
      } else
   #endif
      {
         z *= c->dimensions;
         if (c->sequence_p) {
            for (i=0; i < effective; ++i) {
               float val = CODEBOOK_ELEMENT_FAST(c,z+i) + last;
               if (outputs[c_inter])
                  outputs[c_inter][p_inter] += val;
               if (++c_inter == ch) { c_inter = 0; ++p_inter; }
               last = val;
            }
         } else {
            for (i=0; i < effective; ++i) {
               float val = CODEBOOK_ELEMENT_FAST(c,z+i) + last;
               if (outputs[c_inter])
                  outputs[c_inter][p_inter] += val;
               if (++c_inter == ch) { c_inter = 0; ++p_inter; }
            }
         }
      }

      total_decode -= effective;
   }
   *c_inter_p = c_inter;
   *p_inter_p = p_inter;
   return TRUE;
}